

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

void __thiscall icu_63::CalendarService::CalendarService(CalendarService *this)

{
  DefaultCalendarFactory *this_00;
  UnicodeString *dname;
  ConstChar16Ptr local_70;
  char16_t *local_68;
  UErrorCode status;
  
  local_70.p_ = L"Calendar";
  UnicodeString::UnicodeString((UnicodeString *)&status,'\x01',&local_70,-1);
  dname = (UnicodeString *)&status;
  ICULocaleService::ICULocaleService(&this->super_ICULocaleService,dname);
  UnicodeString::~UnicodeString((UnicodeString *)&status);
  local_68 = local_70.p_;
  (this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier =
       (_func_int **)&PTR__CalendarService_003a0478;
  status = U_ZERO_ERROR;
  this_00 = (DefaultCalendarFactory *)UMemory::operator_new((UMemory *)0x90,(size_t)dname);
  if (this_00 != (DefaultCalendarFactory *)0x0) {
    DefaultCalendarFactory::DefaultCalendarFactory(this_00);
  }
  (*(this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier[9])
            (this,this_00,&status);
  return;
}

Assistant:

CalendarService()
        : ICULocaleService(UNICODE_STRING_SIMPLE("Calendar"))
    {
        UErrorCode status = U_ZERO_ERROR;
        registerFactory(new DefaultCalendarFactory(), status);
    }